

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_reshape_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  int iVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  Layer *pLVar5;
  int *piVar6;
  bool bVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong local_38;
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar9 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_38 = 1;
  uVar8 = 0;
  do {
    if (uVar8 == uVar9) {
      return 0;
    }
    bVar7 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar8]->type,"Pooling");
    if ((!bVar7) &&
       (pLVar4 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar8],
       *(int *)((long)&pLVar4[1].userdata + 4) != 0)) {
      iVar1 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar10 = local_38; uVar10 < uVar9; uVar10 = uVar10 + 1) {
        bVar7 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar10]->type,"Reshape");
        if (((!bVar7) &&
            (pLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar10],
            piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar6 == 4)) && (*piVar6 == iVar1)) {
          if (((uVar9 != uVar10) &&
              (pLVar5 = (((this->super_ModelWriter).layers)->
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10],
              *(int *)((long)&pLVar5[1]._vptr_Layer + 4) == -0xe9)) &&
             ((iVar1._0_1_ = pLVar5[1].support_bf16_storage,
              iVar1._1_1_ = pLVar5[1].support_fp16_storage,
              iVar1._2_1_ = pLVar5[1].support_int8_storage,
              iVar1._3_1_ = pLVar5[1].support_image_storage, iVar1 == -0xe9 &&
              (iVar2._0_1_ = pLVar5[1].support_tensor_storage,
              iVar2._1_1_ = pLVar5[1].support_reserved_00,
              iVar2._2_1_ = pLVar5[1].support_reserved_0, iVar2._3_1_ = pLVar5[1].support_reserved_1
              , iVar2 == 0)))) {
            fprintf(_stderr,"eliminate_reshape_after_global_pooling %s %s\n",
                    (pLVar4->name)._M_dataplus._M_p,(pLVar5->name)._M_dataplus._M_p);
            iVar1 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar1;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar1].producer = (int)uVar8;
            std::__cxx11::string::assign((char *)&pLVar5->type);
          }
          break;
        }
      }
    }
    uVar8 = uVar8 + 1;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_reshape_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Reshape
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Reshape")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[j];
        if (reshape->h != -233 || reshape->c != -233 || reshape->permute != 0)
            continue;

        fprintf(stderr, "eliminate_reshape_after_global_pooling %s %s\n", pooling->name.c_str(), reshape->name.c_str());

        int top_blob_index_final = reshape->tops[0];
        pooling->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        reshape->type = "ncnnfused";
    }

    return 0;
}